

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderProgram
          (GLShaderProgram *this,
          shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *compiledProgram_)

{
  element_type *this_00;
  undefined8 *in_RDI;
  undefined7 in_stack_00000060;
  bool in_stack_00000067;
  GLCompiledProgram *in_stack_ffffffffffffffb8;
  ShaderProgram *in_stack_ffffffffffffffc0;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *this_01;
  
  this_00 = std::
            __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4eaf82);
  GLCompiledProgram::getDrawMode(this_00);
  ShaderProgram::ShaderProgram
            (in_stack_ffffffffffffffc0,(DrawMode)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  *in_RDI = &PTR__GLShaderProgram_0098f4d0;
  std::
  __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4eafbc);
  GLCompiledProgram::getUniforms(in_stack_ffffffffffffffb8);
  std::
  __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4eafe3);
  GLCompiledProgram::getAttributes(in_stack_ffffffffffffffb8);
  this_01 = (shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)(in_RDI + 0xe)
  ;
  std::
  __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4eb00a);
  GLCompiledProgram::getTextures(in_stack_ffffffffffffffb8);
  std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>::shared_ptr
            (this_01,(shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)
                     (in_RDI + 0x11));
  (*glad_glGenVertexArrays)(1,(GLuint *)(in_RDI + 0x13));
  checkGLError(in_stack_00000067);
  createBuffers((GLShaderProgram *)CONCAT17(in_stack_00000067,in_stack_00000060));
  checkGLError(in_stack_00000067);
  return;
}

Assistant:

GLShaderProgram::GLShaderProgram(const std::shared_ptr<GLCompiledProgram>& compiledProgram_)
    : ShaderProgram(compiledProgram_->getDrawMode()), uniforms(compiledProgram_->getUniforms()),
      attributes(compiledProgram_->getAttributes()), textures(compiledProgram_->getTextures()),
      compiledProgram(compiledProgram_) {

  // Create a VAO
  glGenVertexArrays(1, &vaoHandle);
  checkGLError();

  createBuffers(); // only handles texture & index things, attributes are lazily created
  checkGLError();
}